

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O3

string * __thiscall
cppurses::to_string_abi_cxx11_(string *__return_storage_ptr__,cppurses *this,Type type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "MouseButtonPress";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "MouseButtonRelease";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "MouseButtonDblClick";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "MouseWheel";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "MouseMove";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "KeyPress";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "KeyRelease";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "FocusIn";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "FocusOut";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "Paint";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "Move";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Resize";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "TerminalResize";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "ChildAdded";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "ChildRemoved";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "ChildPolished";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "Enable";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "Disable";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "Delete";
    pcVar1 = "";
    break;
  case 0x14:
    pcVar2 = "Timer";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "Custom";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "None";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

auto to_string(Event::Type type) -> std::string
{
    switch (type) {
        case Event::MouseButtonPress: return "MouseButtonPress";
        case Event::MouseButtonRelease: return "MouseButtonRelease";
        case Event::MouseButtonDblClick: return "MouseButtonDblClick";
        case Event::MouseWheel: return "MouseWheel";
        case Event::MouseMove: return "MouseMove";
        case Event::KeyPress: return "KeyPress";
        case Event::KeyRelease: return "KeyRelease";
        case Event::FocusIn: return "FocusIn";
        case Event::FocusOut: return "FocusOut";
        case Event::Paint: return "Paint";
        case Event::Move: return "Move";
        case Event::Resize: return "Resize";
        case Event::TerminalResize: return "TerminalResize";
        case Event::ChildAdded: return "ChildAdded";
        case Event::ChildRemoved: return "ChildRemoved";
        case Event::ChildPolished: return "ChildPolished";
        case Event::Enable: return "Enable";
        case Event::Disable: return "Disable";
        case Event::Delete: return "Delete";
        case Event::Timer: return "Timer";
        case Event::Custom: return "Custom";
        default: return "None";
    }
}